

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSampleID>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceSampleID> *this,
               VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  TextureFormat TVar1;
  uint y;
  uint uVar2;
  uint z;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ConstPixelBufferAccess local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  string *local_40;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *local_38;
  
  local_70.m_data = (void *)(ulong)imageMSInfo->samples;
  bVar4 = local_70.m_data != (void *)0x0;
  local_38 = dataPerSample;
  if (bVar4) {
    local_40 = (string *)&__return_storage_ptr__->m_description;
    local_48 = &(__return_storage_ptr__->m_description).field_2;
    pvVar3 = (void *)0x0;
    do {
      bVar5 = (imageMSInfo->extent).depth != 0;
      if (bVar5) {
        uVar2 = 0;
        do {
          bVar6 = (imageMSInfo->extent).height != 0;
          if (bVar6) {
            z = 0;
            do {
              if ((imageMSInfo->extent).width != 0) {
                y = 0;
                do {
                  tcu::ConstPixelBufferAccess::getPixelInt
                            (&local_70,
                             (int)(local_38->
                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (int)pvVar3 * 0x28,y,
                             z);
                  if (pvVar3 != (void *)((ulong)local_70.m_format & 0xffffffff)) {
                    TVar1 = (TextureFormat)(local_70.m_size.m_data + 2);
                    local_70.m_format = TVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_70,"gl_SampleID does not have correct value","");
                    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                    (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_48;
                    std::__cxx11::string::_M_construct<char*>
                              (local_40,local_70.m_format,
                               (undefined1 *)
                               (local_70.m_size.m_data._0_8_ + (long)local_70.m_format));
                    if (local_70.m_format != TVar1) {
                      operator_delete((void *)local_70.m_format,local_70._16_8_ + 1);
                    }
                    if (!bVar6) goto LAB_004ed92d;
                    if (!bVar5) goto LAB_004ed949;
                    if (bVar4) {
                      return __return_storage_ptr__;
                    }
                    goto LAB_004ed95a;
                  }
                  y = y + 1;
                } while (y < (imageMSInfo->extent).width);
              }
              z = z + 1;
              bVar6 = z < (imageMSInfo->extent).height;
            } while (bVar6);
          }
LAB_004ed92d:
          uVar2 = uVar2 + 1;
          bVar5 = uVar2 < (imageMSInfo->extent).depth;
        } while (bVar5);
      }
LAB_004ed949:
      pvVar3 = (void *)((long)pvVar3 + 1);
      bVar4 = pvVar3 < local_70.m_data;
    } while (pvVar3 != local_70.m_data);
  }
LAB_004ed95a:
  TVar1 = (TextureFormat)(local_70.m_size.m_data + 2);
  local_70.m_format = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Passed","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_70.m_format,
             (undefined1 *)(local_70.m_size.m_data._0_8_ + (long)local_70.m_format));
  if (local_70.m_format != TVar1) {
    operator_delete((void *)local_70.m_format,local_70._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSampleID>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																			 const vk::VkImageCreateInfo&						imageRSInfo,
																			 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																			 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	DE_UNREF(imageRSInfo);
	DE_UNREF(dataRS);

	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
	{
		for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
		for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
		for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
		{
			const deUint32 sampleID = dataPerSample[sampleNdx].getPixelUint(x, y, z).x();

			if (sampleID != sampleNdx)
				return tcu::TestStatus::fail("gl_SampleID does not have correct value");
		}
	}

	return tcu::TestStatus::pass("Passed");
}